

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O2

void __thiscall
duckdb::InvalidTypeException::InvalidTypeException
          (InvalidTypeException *this,LogicalType *type,string *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  LogicalType::ToString_abi_cxx11_(&local_38,type);
  ::std::operator+(&bStack_98,"Invalid Type [",&local_38);
  ::std::operator+(&local_78,&bStack_98,"]: ");
  ::std::operator+(&local_58,&local_78,msg);
  Exception::Exception(&this->super_Exception,INVALID_TYPE,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&bStack_98);
  ::std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_027956b0;
  return;
}

Assistant:

InvalidTypeException::InvalidTypeException(const LogicalType &type, const string &msg)
    : Exception(ExceptionType::INVALID_TYPE, "Invalid Type [" + type.ToString() + "]: " + msg) {
}